

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

index_t __thiscall xLearn::OndiskReader::Samples(OndiskReader *this,DMatrix **matrix)

{
  DMatrix *pDVar1;
  Parser *pPVar2;
  long lVar3;
  index_t iVar4;
  size_t sVar5;
  long __off;
  size_t len;
  
  len = (this->super_Reader).block_size_ << 0x14;
  sVar5 = ReadDataFromDisk(this->file_ptr_,(this->super_Reader).block_,len);
  if (sVar5 == 0) {
    *matrix = (DMatrix *)0x0;
    iVar4 = 0;
  }
  else {
    if (sVar5 == len) {
      sVar5 = sVar5 + 1;
      __off = 1;
      do {
        __off = __off + -1;
        lVar3 = sVar5 - 2;
        sVar5 = sVar5 - 1;
      } while ((this->super_Reader).block_[lVar3] != '\n');
      fseek((FILE *)this->file_ptr_,__off,1);
    }
    pPVar2 = (this->super_Reader).parser_;
    pDVar1 = &(this->super_Reader).data_samples_;
    (*pPVar2->_vptr_Parser[2])(pPVar2,(this->super_Reader).block_,sVar5,pDVar1,1);
    *matrix = pDVar1;
    iVar4 = (this->super_Reader).data_samples_.row_length;
  }
  return iVar4;
}

Assistant:

index_t OndiskReader::Samples(DMatrix* &matrix) {
  // Convert MB to Byte
  uint64 read_byte = block_size_ * 1024 * 1024;
  // Read a block of data from disk file
  size_t ret = ReadDataFromDisk(file_ptr_, block_, read_byte);
  if (ret == 0) {
    matrix = nullptr;
    return 0;
  } else if (ret == read_byte) {
    // Find the last '\n', and shrink back file pointer
    shrink_block(block_, &ret, file_ptr_);
  } // else ret < read_byte: we don't need shrink_block()
  // Parse block to data_sample_
  parser_->Parse(block_, ret, data_samples_, true);
  matrix = &data_samples_;
  return data_samples_.row_length;
}